

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcUtils.c
# Opt level: O2

Mvc_Cover_t * Mvc_CoverTranspose(Mvc_Cover_t *pCover)

{
  int *piVar1;
  Mvc_Manager_t *pMem;
  int nBits;
  Mvc_Cover_t *pCover_00;
  Mvc_Cube_t *pMVar2;
  int _i_;
  uint uVar3;
  Mvc_Cube_t *pMVar4;
  uint uVar5;
  Mvc_List_t *pList;
  
  pMem = pCover->pMem;
  nBits = Mvc_CoverReadCubeNum(pCover);
  pCover_00 = Mvc_CoverAlloc(pMem,nBits);
  for (uVar5 = 0; (int)uVar5 < pCover->nBits; uVar5 = uVar5 + 1) {
    pMVar2 = Mvc_CubeAlloc(pCover_00);
    uVar3 = *(uint *)&pMVar2->field_0x8 & 0xffffff;
    if (uVar3 == 0) {
      pMVar2->pData[0] = 0;
    }
    else if (uVar3 == 1) {
      *(undefined8 *)pMVar2->pData = 0;
    }
    else {
      for (; -1 < (int)uVar3; uVar3 = uVar3 - 1) {
        pMVar2->pData[uVar3] = 0;
      }
    }
    uVar3 = 0;
    pMVar4 = (Mvc_Cube_t *)&pCover->lCubes;
    while (pMVar4 = pMVar4->pNext, pMVar4 != (Mvc_Cube_t *)0x0) {
      if ((pMVar4->pData[uVar5 >> 5] & 1 << ((byte)uVar5 & 0x1f)) != 0) {
        pMVar2->pData[uVar3 >> 5] = pMVar2->pData[uVar3 >> 5] | 1 << ((byte)uVar3 & 0x1f);
      }
      uVar3 = uVar3 + 1;
    }
    pMVar4 = (Mvc_Cube_t *)&pCover_00->lCubes;
    if ((pCover_00->lCubes).pHead != (Mvc_Cube_t *)0x0) {
      pMVar4 = (pCover_00->lCubes).pTail;
    }
    pMVar4->pNext = pMVar2;
    (pCover_00->lCubes).pTail = pMVar2;
    pMVar2->pNext = (Mvc_Cube_t *)0x0;
    piVar1 = &(pCover_00->lCubes).nItems;
    *piVar1 = *piVar1 + 1;
  }
  return pCover_00;
}

Assistant:

Mvc_Cover_t * Mvc_CoverTranspose( Mvc_Cover_t * pCover )
{
    Mvc_Cover_t * pRes;
    Mvc_Cube_t * pCubeRes, * pCube;
    int nWord, nBit, i, iCube;

    pRes = Mvc_CoverAlloc( pCover->pMem, Mvc_CoverReadCubeNum(pCover) );
    for ( i = 0; i < pCover->nBits; i++ )
    {
        // get the word and bit of this literal
        nWord = Mvc_CubeWhichWord(i);
        nBit  = Mvc_CubeWhichBit(i);
        // get the transposed cube
        pCubeRes = Mvc_CubeAlloc( pRes );
        Mvc_CubeBitClean( pCubeRes );
        iCube = 0;
        Mvc_CoverForEachCube( pCover, pCube )
        {
            if ( pCube->pData[nWord] & (1<<nBit) )
                Mvc_CubeBitInsert( pCubeRes, iCube );
            iCube++;
        }
        Mvc_CoverAddCubeTail( pRes, pCubeRes ); 
    }
    return pRes;
}